

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

void __thiscall testExtendedKalmanFilter::KalmanFunctor::KalmanFunctor(KalmanFunctor *this)

{
  Matrix<double,__1,__1,_0,__1,__1> local_120;
  double local_108;
  Matrix<double,__1,__1,_0,__1,__1> local_100;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_e8;
  Matrix<double,__1,_1,_0,__1,_1> local_c0;
  Matrix<double,__1,_1,_0,__1,_1> local_b0;
  double local_a0;
  Matrix<double,__1,_1,_0,__1,_1> local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_88;
  double local_60;
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_48;
  KalmanFunctor *local_10;
  KalmanFunctor *this_local;
  
  local_10 = this;
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            (&this->super_DynamicalSystemFunctorBase);
  *(undefined ***)this = &PTR__KalmanFunctor_00162bd8;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->s_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->t_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->m_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->n_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->a_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->c_);
  stateObservation::ObserverBase::stateVectorRandom();
  local_60 = 0.1;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_48,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,&local_60);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->s_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_58);
  stateObservation::ObserverBase::measureVectorRandom();
  local_a0 = 0.1;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_88,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_98,&local_a0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->m_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_88);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_98);
  stateObservation::ObserverBase::stateVectorRandom();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->t_,&local_b0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_b0);
  stateObservation::ObserverBase::measureVectorRandom();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->n_,&local_c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_c0);
  stateObservation::KalmanFilterBase::getAmatrixRandom();
  local_108 = 0.6;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_e8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_100,&local_108);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->a_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_100);
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->c_,&local_120);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_120);
  return;
}

Assistant:

KalmanFunctor()
    {
      s_ = f.stateVectorRandom() * 0.1;
      m_ = f.measureVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
      a_ = f.getAmatrixRandom() * 0.6;
      c_ = f.getCmatrixRandom();
    }